

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * __thiscall
gl4cts::anon_unknown_0::BasicStdLayoutCase1VS::GetInput
          (BasicStdLayoutCase1VS *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  char *pcVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  BasicStdLayoutCase1VS *this_local;
  
  pcVar1 = GetInputC1(in_data);
  return pcVar1;
}

Assistant:

virtual const char* GetInput(std::vector<GLubyte> in_data[4])
	{
		return GetInputC1(in_data);
	}